

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O2

bool ImGui::SliderBehaviorT<int,int,float>
               (ImRect *bb,ImGuiID id,ImGuiDataType data_type,int *v,int v_min,int v_max,
               char *format,ImGuiSliderFlags flags,ImRect *out_grab_bb)

{
  ImGuiContext *pIVar1;
  uint uVar2;
  int iVar3;
  ImGuiDataType v_00;
  ImGuiContext *g;
  float *pfVar4;
  bool bVar5;
  undefined1 is_logarithmic;
  uint uVar6;
  uint uVar7;
  ulong idx;
  uint uVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  ImVec2 IVar16;
  float fVar17;
  float logarithmic_zero_epsilon;
  float fVar18;
  
  pIVar1 = GImGui;
  uVar2 = flags & 0x100000;
  idx = (ulong)(uVar2 >> 0x14);
  uVar6 = data_type & 0xfffffffe;
  iVar3 = v_max;
  fVar9 = ImVec2::operator[](&bb->Max,idx);
  is_logarithmic = (undefined1)iVar3;
  fVar10 = ImVec2::operator[](&bb->Min,idx);
  uVar7 = v_min - v_max;
  uVar8 = -uVar7;
  if (0 < (int)uVar7) {
    uVar8 = uVar7;
  }
  fVar10 = (fVar9 - fVar10) + -4.0;
  fVar9 = (pIVar1->Style).GrabMinSize;
  if (uVar6 != 8) {
    fVar11 = fVar10 / (float)(int)(uVar8 + 1);
    uVar7 = -(uint)(fVar9 <= fVar11);
    fVar9 = (float)(~uVar7 & (uint)fVar9 | (uint)fVar11 & uVar7);
  }
  fVar11 = ImVec2::operator[](&bb->Min,idx);
  fVar12 = ImVec2::operator[](&bb->Max,idx);
  if (fVar10 <= fVar9) {
    fVar9 = fVar10;
  }
  fVar18 = fVar10 - fVar9;
  fVar17 = 0.0;
  logarithmic_zero_epsilon = 0.0;
  if ((flags & 0x20U) != 0) {
    if (uVar6 == 8) {
      iVar3 = ImParseFormatPrecision(format,3);
      fVar17 = (float)iVar3;
    }
    else {
      fVar17 = 1.0;
    }
    logarithmic_zero_epsilon = powf(0.1,fVar17);
    fVar17 = fVar18;
    if (fVar18 <= 1.0) {
      fVar17 = 1.0;
    }
    fVar17 = ((pIVar1->Style).LogSliderDeadzone * 0.5) / fVar17;
  }
  fVar11 = fVar11 + 2.0 + fVar9 * 0.5;
  if (pIVar1->ActiveId == id) {
    if (pIVar1->ActiveIdSource == ImGuiInputSource_Nav) {
      if (pIVar1->ActiveIdIsJustActivated == true) {
        pIVar1->SliderCurrentAccum = 0.0;
        pIVar1->SliderCurrentAccumDirty = false;
      }
      IVar16 = GetNavInputAmount2d(3,ImGuiInputReadMode_RepeatFast,0.0,0.0);
      fVar18 = IVar16.x;
      if (uVar2 != 0) {
        fVar18 = -IVar16.y;
      }
      if ((fVar18 != 0.0) || (NAN(fVar18))) {
        if ((uVar6 == 8) && (iVar3 = ImParseFormatPrecision(format,3), 0 < iVar3)) {
          fVar18 = fVar18 / 100.0;
          if (0.0 < (GImGui->IO).NavInputs[0xe]) {
            fVar18 = fVar18 / 10.0;
          }
        }
        else if ((uVar8 < 0x65) || (0.0 < (GImGui->IO).NavInputs[0xe])) {
          fVar18 = *(float *)(&DAT_0019a978 + (ulong)(fVar18 < 0.0) * 4) / (float)(int)uVar8;
        }
        else {
          fVar18 = fVar18 / 100.0;
        }
        uVar8 = -(uint)(0.0 < (GImGui->IO).NavInputs[0xf]);
        fVar18 = (float)(~uVar8 & (uint)fVar18 | (uint)(fVar18 * 10.0) & uVar8) +
                 pIVar1->SliderCurrentAccum;
        pIVar1->SliderCurrentAccum = fVar18;
        pIVar1->SliderCurrentAccumDirty = true;
      }
      else {
        fVar18 = pIVar1->SliderCurrentAccum;
      }
      if ((pIVar1->NavActivatePressedId == id) && (pIVar1->ActiveIdIsJustActivated == false)) {
        ClearActiveID();
      }
      else if (pIVar1->SliderCurrentAccumDirty == true) {
        uVar8 = (flags & 0x20U) >> 5;
        fVar14 = ScaleRatioFromValueT<int,int,float>
                           ((ImGui *)(ulong)(uint)data_type,*v,v_min,v_max,uVar8,
                            (bool)is_logarithmic,logarithmic_zero_epsilon,fVar17);
        if (((1.0 <= fVar14) && (0.0 < fVar18)) || ((fVar14 <= 0.0 && (fVar18 < 0.0)))) {
          pIVar1->SliderCurrentAccum = 0.0;
          pIVar1->SliderCurrentAccumDirty = false;
          goto LAB_0014a9db;
        }
        fVar15 = fVar18 + fVar14;
        fVar13 = 1.0;
        if (fVar15 <= 1.0) {
          fVar13 = fVar15;
        }
        fVar13 = (float)(~-(uint)(fVar15 < 0.0) & (uint)fVar13);
        v_00 = ScaleValueFromRatioT<int,int,float>
                         (data_type,fVar13,v_min,v_max,SUB41(uVar8,0),logarithmic_zero_epsilon,
                          fVar17);
        if ((flags & 0x40U) == 0) {
          v_00 = RoundScalarWithFormatT<int,int>(format,data_type,v_00);
        }
        fVar15 = ScaleRatioFromValueT<int,int,float>
                           ((ImGui *)(ulong)(uint)data_type,v_00,v_min,v_max,uVar8,
                            (bool)is_logarithmic,logarithmic_zero_epsilon,fVar17);
        fVar15 = fVar15 - fVar14;
        bVar5 = fVar18 <= fVar15;
        if (0.0 < fVar18) {
          bVar5 = fVar15 < fVar18;
        }
        if (!bVar5) {
          fVar15 = fVar18;
        }
        pIVar1->SliderCurrentAccum = pIVar1->SliderCurrentAccum - fVar15;
        pIVar1->SliderCurrentAccumDirty = false;
        goto LAB_0014a61b;
      }
      bVar5 = false;
      goto LAB_0014a675;
    }
    if (pIVar1->ActiveIdSource == ImGuiInputSource_Mouse) {
      if ((pIVar1->IO).MouseDown[0] == false) {
        ClearActiveID();
LAB_0014a9db:
        bVar5 = false;
        goto LAB_0014a675;
      }
      pfVar4 = ImVec2::operator[](&(pIVar1->IO).MousePos,idx);
      fVar13 = 0.0;
      if (0.0 < fVar18) {
        fVar18 = (*pfVar4 - fVar11) / fVar18;
        fVar13 = 1.0;
        if (fVar18 <= 1.0) {
          fVar13 = fVar18;
        }
        fVar13 = (float)(~-(uint)(fVar18 < 0.0) & (uint)fVar13);
      }
      if (uVar2 != 0) {
        fVar13 = 1.0 - fVar13;
      }
LAB_0014a61b:
      iVar3 = ScaleValueFromRatioT<int,int,float>
                        (data_type,fVar13,v_min,v_max,SUB41((flags & 0x20U) >> 5,0),
                         logarithmic_zero_epsilon,fVar17);
      if ((flags & 0x40U) == 0) {
        iVar3 = RoundScalarWithFormatT<int,int>(format,data_type,iVar3);
      }
      if (*v != iVar3) {
        *v = iVar3;
        bVar5 = true;
        goto LAB_0014a675;
      }
    }
  }
  bVar5 = false;
LAB_0014a675:
  if (1.0 <= fVar10) {
    fVar10 = ScaleRatioFromValueT<int,int,float>
                       ((ImGui *)(ulong)(uint)data_type,*v,v_min,v_max,(flags & 0x20U) >> 5,
                        (bool)is_logarithmic,logarithmic_zero_epsilon,fVar17);
    if (uVar2 != 0) {
      fVar10 = 1.0 - fVar10;
    }
    fVar11 = (((fVar12 + -2.0) - fVar9 * 0.5) - fVar11) * fVar10 + fVar11;
    if (uVar2 != 0) {
      fVar10 = (bb->Max).x;
      (out_grab_bb->Min).x = (bb->Min).x + 2.0;
      (out_grab_bb->Min).y = -fVar9 * 0.5 + fVar11;
      (out_grab_bb->Max).x = fVar10 + -2.0;
      (out_grab_bb->Max).y = fVar9 * 0.5 + fVar11;
    }
    else {
      fVar10 = (bb->Min).y;
      fVar12 = (bb->Max).y;
      (out_grab_bb->Min).x = -fVar9 * 0.5 + fVar11;
      (out_grab_bb->Min).y = fVar10 + 2.0;
      (out_grab_bb->Max).x = fVar9 * 0.5 + fVar11;
      (out_grab_bb->Max).y = fVar12 + -2.0;
    }
  }
  else {
    IVar16 = bb->Min;
    out_grab_bb->Min = IVar16;
    out_grab_bb->Max = IVar16;
  }
  return bVar5;
}

Assistant:

bool ImGui::SliderBehaviorT(const ImRect& bb, ImGuiID id, ImGuiDataType data_type, TYPE* v, const TYPE v_min, const TYPE v_max, const char* format, ImGuiSliderFlags flags, ImRect* out_grab_bb)
{
    ImGuiContext& g = *GImGui;
    const ImGuiStyle& style = g.Style;

    const ImGuiAxis axis = (flags & ImGuiSliderFlags_Vertical) ? ImGuiAxis_Y : ImGuiAxis_X;
    const bool is_logarithmic = (flags & ImGuiSliderFlags_Logarithmic) != 0;
    const bool is_floating_point = (data_type == ImGuiDataType_Float) || (data_type == ImGuiDataType_Double);

    const float grab_padding = 2.0f;
    const float slider_sz = (bb.Max[axis] - bb.Min[axis]) - grab_padding * 2.0f;
    float grab_sz = style.GrabMinSize;
    SIGNEDTYPE v_range = (v_min < v_max ? v_max - v_min : v_min - v_max);
    if (!is_floating_point && v_range >= 0)                                             // v_range < 0 may happen on integer overflows
        grab_sz = ImMax((float)(slider_sz / (v_range + 1)), style.GrabMinSize);  // For integer sliders: if possible have the grab size represent 1 unit
    grab_sz = ImMin(grab_sz, slider_sz);
    const float slider_usable_sz = slider_sz - grab_sz;
    const float slider_usable_pos_min = bb.Min[axis] + grab_padding + grab_sz * 0.5f;
    const float slider_usable_pos_max = bb.Max[axis] - grab_padding - grab_sz * 0.5f;

    float logarithmic_zero_epsilon = 0.0f; // Only valid when is_logarithmic is true
    float zero_deadzone_halfsize = 0.0f; // Only valid when is_logarithmic is true
    if (is_logarithmic)
    {
        // When using logarithmic sliders, we need to clamp to avoid hitting zero, but our choice of clamp value greatly affects slider precision. We attempt to use the specified precision to estimate a good lower bound.
        const int decimal_precision = is_floating_point ? ImParseFormatPrecision(format, 3) : 1;
        logarithmic_zero_epsilon = ImPow(0.1f, (float)decimal_precision);
        zero_deadzone_halfsize = (style.LogSliderDeadzone * 0.5f) / ImMax(slider_usable_sz, 1.0f);
    }

    // Process interacting with the slider
    bool value_changed = false;
    if (g.ActiveId == id)
    {
        bool set_new_value = false;
        float clicked_t = 0.0f;
        if (g.ActiveIdSource == ImGuiInputSource_Mouse)
        {
            if (!g.IO.MouseDown[0])
            {
                ClearActiveID();
            }
            else
            {
                const float mouse_abs_pos = g.IO.MousePos[axis];
                clicked_t = (slider_usable_sz > 0.0f) ? ImClamp((mouse_abs_pos - slider_usable_pos_min) / slider_usable_sz, 0.0f, 1.0f) : 0.0f;
                if (axis == ImGuiAxis_Y)
                    clicked_t = 1.0f - clicked_t;
                set_new_value = true;
            }
        }
        else if (g.ActiveIdSource == ImGuiInputSource_Nav)
        {
            if (g.ActiveIdIsJustActivated)
            {
                g.SliderCurrentAccum = 0.0f; // Reset any stored nav delta upon activation
                g.SliderCurrentAccumDirty = false;
            }

            const ImVec2 input_delta2 = GetNavInputAmount2d(ImGuiNavDirSourceFlags_Keyboard | ImGuiNavDirSourceFlags_PadDPad, ImGuiInputReadMode_RepeatFast, 0.0f, 0.0f);
            float input_delta = (axis == ImGuiAxis_X) ? input_delta2.x : -input_delta2.y;
            if (input_delta != 0.0f)
            {
                const int decimal_precision = is_floating_point ? ImParseFormatPrecision(format, 3) : 0;
                if (decimal_precision > 0)
                {
                    input_delta /= 100.0f;    // Gamepad/keyboard tweak speeds in % of slider bounds
                    if (IsNavInputDown(ImGuiNavInput_TweakSlow))
                        input_delta /= 10.0f;
                }
                else
                {
                    if ((v_range >= -100.0f && v_range <= 100.0f) || IsNavInputDown(ImGuiNavInput_TweakSlow))
                        input_delta = ((input_delta < 0.0f) ? -1.0f : +1.0f) / (float)v_range; // Gamepad/keyboard tweak speeds in integer steps
                    else
                        input_delta /= 100.0f;
                }
                if (IsNavInputDown(ImGuiNavInput_TweakFast))
                    input_delta *= 10.0f;

                g.SliderCurrentAccum += input_delta;
                g.SliderCurrentAccumDirty = true;
            }

            float delta = g.SliderCurrentAccum;
            if (g.NavActivatePressedId == id && !g.ActiveIdIsJustActivated)
            {
                ClearActiveID();
            }
            else if (g.SliderCurrentAccumDirty)
            {
                clicked_t = ScaleRatioFromValueT<TYPE, SIGNEDTYPE, FLOATTYPE>(data_type, *v, v_min, v_max, is_logarithmic, logarithmic_zero_epsilon, zero_deadzone_halfsize);

                if ((clicked_t >= 1.0f && delta > 0.0f) || (clicked_t <= 0.0f && delta < 0.0f)) // This is to avoid applying the saturation when already past the limits
                {
                    set_new_value = false;
                    g.SliderCurrentAccum = 0.0f; // If pushing up against the limits, don't continue to accumulate
                }
                else
                {
                    set_new_value = true;
                    float old_clicked_t = clicked_t;
                    clicked_t = ImSaturate(clicked_t + delta);

                    // Calculate what our "new" clicked_t will be, and thus how far we actually moved the slider, and subtract this from the accumulator
                    TYPE v_new = ScaleValueFromRatioT<TYPE, SIGNEDTYPE, FLOATTYPE>(data_type, clicked_t, v_min, v_max, is_logarithmic, logarithmic_zero_epsilon, zero_deadzone_halfsize);
                    if (!(flags & ImGuiSliderFlags_NoRoundToFormat))
                        v_new = RoundScalarWithFormatT<TYPE, SIGNEDTYPE>(format, data_type, v_new);
                    float new_clicked_t = ScaleRatioFromValueT<TYPE, SIGNEDTYPE, FLOATTYPE>(data_type, v_new, v_min, v_max, is_logarithmic, logarithmic_zero_epsilon, zero_deadzone_halfsize);

                    if (delta > 0)
                        g.SliderCurrentAccum -= ImMin(new_clicked_t - old_clicked_t, delta);
                    else
                        g.SliderCurrentAccum -= ImMax(new_clicked_t - old_clicked_t, delta);
                }

                g.SliderCurrentAccumDirty = false;
            }
        }

        if (set_new_value)
        {
            TYPE v_new = ScaleValueFromRatioT<TYPE, SIGNEDTYPE, FLOATTYPE>(data_type, clicked_t, v_min, v_max, is_logarithmic, logarithmic_zero_epsilon, zero_deadzone_halfsize);

            // Round to user desired precision based on format string
            if (!(flags & ImGuiSliderFlags_NoRoundToFormat))
                v_new = RoundScalarWithFormatT<TYPE, SIGNEDTYPE>(format, data_type, v_new);

            // Apply result
            if (*v != v_new)
            {
                *v = v_new;
                value_changed = true;
            }
        }
    }

    if (slider_sz < 1.0f)
    {
        *out_grab_bb = ImRect(bb.Min, bb.Min);
    }
    else
    {
        // Output grab position so it can be displayed by the caller
        float grab_t = ScaleRatioFromValueT<TYPE, SIGNEDTYPE, FLOATTYPE>(data_type, *v, v_min, v_max, is_logarithmic, logarithmic_zero_epsilon, zero_deadzone_halfsize);
        if (axis == ImGuiAxis_Y)
            grab_t = 1.0f - grab_t;
        const float grab_pos = ImLerp(slider_usable_pos_min, slider_usable_pos_max, grab_t);
        if (axis == ImGuiAxis_X)
            *out_grab_bb = ImRect(grab_pos - grab_sz * 0.5f, bb.Min.y + grab_padding, grab_pos + grab_sz * 0.5f, bb.Max.y - grab_padding);
        else
            *out_grab_bb = ImRect(bb.Min.x + grab_padding, grab_pos - grab_sz * 0.5f, bb.Max.x - grab_padding, grab_pos + grab_sz * 0.5f);
    }

    return value_changed;
}